

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O3

void __thiscall QDateTimeEdit::setTime(QDateTimeEdit *this,QTime time)

{
  QAbstractSpinBoxPrivate *this_00;
  char cVar1;
  undefined8 uVar2;
  long in_FS_OFFSET;
  QDateTime local_50 [12];
  int local_44;
  QVariant local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractSpinBoxPrivate **)&(this->super_QAbstractSpinBox).super_QWidget.field_0x8;
  local_44 = time.mds;
  cVar1 = QTime::isValid();
  if (cVar1 != '\0') {
    (**(code **)(*(long *)&this_00->super_QWidgetPrivate + 0xf8))(this_00);
    uVar2 = ::QVariant::toDate();
    QDateTime::QDateTime
              (local_50,uVar2,local_44,&this_00[1].super_QWidgetPrivate.whatsThis.d.size,1);
    ::QVariant::QVariant(&local_40,local_50);
    QAbstractSpinBoxPrivate::setValue(this_00,&local_40,EmitIfChanged,true);
    ::QVariant::~QVariant(&local_40);
    QDateTime::~QDateTime(local_50);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDateTimeEdit::setTime(QTime time)
{
    Q_D(QDateTimeEdit);
    if (time.isValid()) {
        d->clearCache();
        d->setValue(d->dateTimeValue(d->value.toDate(), time), EmitIfChanged);
    }
}